

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RollupOutput::PrettyPrintTree
          (RollupOutput *this,RollupRow *row,size_t indent,OutputOptions *options,ostream *out)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_t in_RCX;
  RollupRow *in_RDX;
  RollupOutput *in_RSI;
  __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  *in_RDI;
  OutputOptions *in_R8;
  RollupRow *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range1;
  ostream *in_stack_000000f0;
  OutputOptions *in_stack_000000f8;
  size_t in_stack_00000100;
  RollupRow *in_stack_00000108;
  RollupOutput *in_stack_00000110;
  RollupOutput *in_stack_ffffffffffffffa8;
  __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_38;
  ostream *out_00;
  RollupOutput *this_00;
  
  PrettyPrintRow(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                 in_stack_000000f0);
  if (((in_RSI->toplevel_row_).name._M_string_length != 0) ||
     ((in_RSI->toplevel_row_).name.field_2._M_allocated_capacity != 0)) {
    sVar2 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size
                      ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                       &(in_RSI->toplevel_row_).filepercent);
    this_00 = in_RSI;
    if (sVar2 == 1) {
      pvVar3 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[]
                         ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                          &(in_RSI->toplevel_row_).filepercent,0);
      sVar2 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size
                        (&pvVar3->sorted_children);
      this_00 = in_RSI;
      if (sVar2 == 0) {
        std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[]
                  ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                   &(in_RSI->toplevel_row_).filepercent,0);
        bVar1 = IsSame((string *)options,(string *)out);
        in_stack_ffffffffffffffa8 = in_RSI;
        if (bVar1) {
          return;
        }
      }
    }
    out_00 = (ostream *)&(this_00->toplevel_row_).filepercent;
    local_38._M_current =
         (RollupRow *)
         std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                   ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                    in_stack_ffffffffffffffa8);
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
              ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
               in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                                      *)in_stack_ffffffffffffffa8), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator*(&local_38);
      PrettyPrintTree(this_00,in_RDX,in_RCX,in_R8,out_00);
      __gnu_cxx::
      __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void RollupOutput::PrettyPrintTree(const RollupRow& row, size_t indent,
                                   const OutputOptions& options,
                                   std::ostream* out) const {
  // Rows are printed before their sub-rows.
  PrettyPrintRow(row, indent, options, out);

  if (!row.size.vm && !row.size.file) {
    return;
  }

  if (row.sorted_children.size() == 1 &&
      row.sorted_children[0].sorted_children.size() == 0 &&
      IsSame(row.name, row.sorted_children[0].name)) {
    return;
  }

  for (const auto& child : row.sorted_children) {
    PrettyPrintTree(child, indent + 2, options, out);
  }
}